

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

string * f8n::timestamp_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  allocator<char> local_69;
  char local_68 [8];
  char buffer [64];
  tm *timeinfo;
  time_t rawtime;
  
  timeinfo = (tm *)0x0;
  time((time_t *)&timeinfo);
  __tp = localtime((time_t *)&timeinfo);
  strftime(local_68,0x40,"%T",__tp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,local_68,&local_69);
  std::allocator<char>::~allocator(&local_69);
  return in_RDI;
}

Assistant:

static std::string timestamp() {
        time_t rawtime = { 0 };
        struct tm * timeinfo;
        char buffer [64];
        time(&rawtime);
        timeinfo = localtime (&rawtime);
        strftime (buffer, sizeof(buffer), "%T", timeinfo);
        return std::string(buffer);
    }